

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O1

bool duckdb::TryGetBoundColumnIndex
               (vector<duckdb::ColumnIndex,_true> *column_ids,Expression *expr,ColumnIndex *result)

{
  string *psVar1;
  ExpressionType EVar2;
  bool bVar3;
  int iVar4;
  BoundFunctionExpression *pBVar5;
  const_reference this;
  BoundColumnRefExpression *pBVar6;
  const_reference pvVar7;
  
  while (EVar2 = (expr->super_BaseExpression).type, EVar2 == BOUND_FUNCTION) {
    pBVar5 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&expr->super_BaseExpression);
    psVar1 = &(pBVar5->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name;
    iVar4 = ::std::__cxx11::string::compare((char *)psVar1);
    if (iVar4 != 0) {
      iVar4 = ::std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 != 0) goto LAB_00698737;
    }
    this = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](&pBVar5->children,0);
    expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (this);
  }
  if (EVar2 == BOUND_COLUMN_REF) {
    pBVar6 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&expr->super_BaseExpression);
    pvVar7 = vector<duckdb::ColumnIndex,_true>::operator[]
                       (column_ids,(pBVar6->binding).column_index);
    result->index = pvVar7->index;
    ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::operator=
              (&(result->child_indexes).
                super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>,
               &(pvVar7->child_indexes).
                super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
    bVar3 = true;
  }
  else {
LAB_00698737:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool TryGetBoundColumnIndex(const vector<ColumnIndex> &column_ids, const Expression &expr, ColumnIndex &result) {
	switch (expr.GetExpressionType()) {
	case ExpressionType::BOUND_COLUMN_REF: {
		auto &ref = expr.Cast<BoundColumnRefExpression>();
		result = column_ids[ref.binding.column_index];
		return true;
	}
	case ExpressionType::BOUND_FUNCTION: {
		auto &func = expr.Cast<BoundFunctionExpression>();
		if (func.function.name == "struct_extract" || func.function.name == "struct_extract_at") {
			auto &child_expr = func.children[0];
			return TryGetBoundColumnIndex(column_ids, *child_expr, result);
		}
		return false;
	}
	default:
		return false;
	}
}